

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::analyzeFinal(Solver *this,Lit p,LSet *out_conflict)

{
  VMap<char> *this_00;
  long lVar1;
  CRef CVar2;
  int iVar3;
  char *pcVar4;
  uint *puVar5;
  int k;
  int j;
  ulong uVar6;
  long lVar7;
  
  IntSet<Minisat::Lit,_Minisat::MkIndexLit>::clear
            (&out_conflict->super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>,false);
  IntSet<Minisat::Lit,_Minisat::MkIndexLit>::insert
            (&out_conflict->super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>,p);
  if ((this->trail_lim).sz != 0) {
    this_00 = &this->seen;
    pcVar4 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                       (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,p.x >> 1);
    *pcVar4 = '\x01';
    lVar1 = (long)(this->trail).sz;
    while (lVar7 = lVar1, *(this->trail_lim).data < lVar7) {
      k = (this->trail).data[lVar7 + -1].x >> 1;
      pcVar4 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,k);
      lVar1 = lVar7 + -1;
      if (*pcVar4 != '\0') {
        CVar2 = reason(this,k);
        if (CVar2 == 0xffffffff) {
          iVar3 = level(this,k);
          if (iVar3 < 1) {
            __assert_fail("level(x) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                          ,0x1d6,"void Minisat::Solver::analyzeFinal(Lit, LSet &)");
          }
          IntSet<Minisat::Lit,_Minisat::MkIndexLit>::insert
                    (&out_conflict->super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>,
                     (Lit)((this->trail).data[lVar7 + -1].x ^ 1));
        }
        else {
          CVar2 = reason(this,k);
          puVar5 = RegionAllocator<unsigned_int>::operator[](&(this->ca).ra,CVar2);
          for (uVar6 = 1; uVar6 < *puVar5 >> 5; uVar6 = uVar6 + 1) {
            iVar3 = level(this,(int)puVar5[uVar6 + 1] >> 1);
            if (0 < iVar3) {
              pcVar4 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                                 (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                                  (int)puVar5[uVar6 + 1] >> 1);
              *pcVar4 = '\x01';
            }
          }
        }
        pcVar4 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                           (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,k);
        *pcVar4 = '\0';
      }
    }
    pcVar4 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                       (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,p.x >> 1);
    *pcVar4 = '\0';
  }
  return;
}

Assistant:

void Solver::analyzeFinal(Lit p, LSet& out_conflict)
{
    out_conflict.clear();
    out_conflict.insert(p);

    if (decisionLevel() == 0)
        return;

    seen[var(p)] = 1;

    for (int i = trail.size()-1; i >= trail_lim[0]; i--){
        Var x = var(trail[i]);
        if (seen[x]){
            if (reason(x) == CRef_Undef){
                assert(level(x) > 0);
                out_conflict.insert(~trail[i]);
            }else{
                Clause& c = ca[reason(x)];
                for (int j = 1; j < c.size(); j++)
                    if (level(var(c[j])) > 0)
                        seen[var(c[j])] = 1;
            }
            seen[x] = 0;
        }
    }

    seen[var(p)] = 0;
}